

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

void vrna_md_defaults_dangles(int d)

{
  if ((uint)d < 4) {
    defaults.dangles = d;
    dangles = d;
    return;
  }
  vrna_message_warning
            (
            "vrna_md_defaults_dangles@model.c: Dangles out of range, must be (0 <= d <= 3). Not changing anything!"
            );
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_dangles(int d)
{
  if ((d >= 0) && (d <= 3)) {
    defaults.dangles = d;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
    dangles = d;
#endif
  } else {
    vrna_message_warning(
      "vrna_md_defaults_dangles@model.c: Dangles out of range, must be (0 <= d <= 3). Not changing anything!");
  }
}